

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::GetSpanVector(ON_PolyCurve *this,double *s)

{
  int iVar1;
  uint uVar2;
  ON_Curve **ppOVar3;
  double *pdVar4;
  double dVar5;
  undefined1 local_58 [8];
  ON_Interval segloc;
  int k;
  int j;
  int i;
  int segment_count;
  double t;
  ON_Interval sp;
  double *s_local;
  ON_PolyCurve *this_local;
  
  sp.m_t[1] = (double)s;
  ON_Interval::ON_Interval((ON_Interval *)&t);
  iVar1 = Count(this);
  k = 0;
  do {
    if (iVar1 <= k) {
      return true;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,k);
    if (*ppOVar3 == (ON_Curve *)0x0) {
      return false;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,k);
    segloc.m_t[1]._4_4_ = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])()
    ;
    if (segloc.m_t[1]._4_4_ == 0) {
      return false;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,k);
    uVar2 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])
                      (*ppOVar3,sp.m_t[1]);
    if ((uVar2 & 1) == 0) {
      return false;
    }
    pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,k);
    dVar5 = *pdVar4;
    pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,k + 1);
    ON_Interval::Set((ON_Interval *)&t,dVar5,*pdVar4);
    ON_Interval::ON_Interval
              ((ON_Interval *)local_58,*(double *)sp.m_t[1],
               *(double *)((long)sp.m_t[1] + (long)segloc.m_t[1]._4_4_ * 8));
    dVar5 = ON_Interval::Min((ON_Interval *)&t);
    if ((dVar5 != *(double *)sp.m_t[1]) || (NAN(dVar5) || NAN(*(double *)sp.m_t[1]))) {
LAB_007f9057:
      for (segloc.m_t[1]._0_4_ = 0; segloc.m_t[1]._0_4_ <= segloc.m_t[1]._4_4_;
          segloc.m_t[1]._0_4_ = segloc.m_t[1]._0_4_ + 1) {
        dVar5 = ON_Interval::NormalizedParameterAt
                          ((ON_Interval *)local_58,
                           *(double *)((long)sp.m_t[1] + (long)segloc.m_t[1]._0_4_ * 8));
        dVar5 = ON_Interval::ParameterAt((ON_Interval *)&t,dVar5);
        *(double *)((long)sp.m_t[1] + (long)segloc.m_t[1]._0_4_ * 8) = dVar5;
      }
    }
    else {
      dVar5 = ON_Interval::Max((ON_Interval *)&t);
      pdVar4 = (double *)((long)sp.m_t[1] + (long)segloc.m_t[1]._4_4_ * 8);
      if ((dVar5 != *pdVar4) || (NAN(dVar5) || NAN(*pdVar4))) goto LAB_007f9057;
    }
    sp.m_t[1] = (double)((long)sp.m_t[1] + (long)segloc.m_t[1]._4_4_ * 8);
    k = k + 1;
  } while( true );
}

Assistant:

bool ON_PolyCurve::GetSpanVector( // span "knots" 
       double* s // array of length SpanCount() + 1 
       ) const
{
  ON_Interval sp;
  double t;
  const int segment_count = Count();
  int i, j, k;
  for ( i = 0; i < segment_count; i++  ) {
    if ( !m_segment[i] )
      return false;
    j = m_segment[i]->SpanCount();
    if ( j == 0 )
      return 0;
    if ( !m_segment[i]->GetSpanVector( s ) )
      return false;
    sp.Set( m_t[i], m_t[i+1] );
		ON_Interval segloc(s[0],s[j]);
    if ( sp.Min() != s[0] || sp.Max() != s[j] ) {
      for ( k = 0; k <= j; k++ ) {
        t = segloc.NormalizedParameterAt(s[k]);
        s[k] = sp.ParameterAt(t);
      }
    }

    s += j;
  }
  return true;
}